

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satelite.cpp
# Opt level: O0

bool __thiscall Clasp::SatElite::addResolvent(SatElite *this,uint32 id,Clause *lhs,Clause *rhs)

{
  SatPreprocessor *pSVar1;
  _func_int ***ppp_Var2;
  bool bVar3;
  Var VVar4;
  int iVar5;
  size_type sVar6;
  Literal *pLVar7;
  reference pLVar8;
  Clause *in_RCX;
  Clause *in_RDX;
  uchar *sig;
  uchar *sig_00;
  uchar *sig_01;
  EVP_PKEY_CTX *pEVar9;
  long in_RDI;
  uchar *in_R8;
  size_t in_R9;
  Literal l;
  uint32 end;
  uint32 i;
  Solver *s;
  Solver *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  long lVar10;
  Solver *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  Literal in_stack_ffffffffffffff64;
  Solver *in_stack_ffffffffffffff68;
  Solver *this_00;
  SatPreprocessor *in_stack_ffffffffffffff70;
  Literal p;
  OccurList *in_stack_ffffffffffffff88;
  SatElite *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa8;
  uint32 uVar11;
  Literal local_3c;
  uint32 local_38;
  uint32 local_34;
  Solver *local_30;
  Clause *local_28;
  Clause *local_20;
  bool local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::clear
            ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 0xb8));
  local_30 = SharedContext::master((SharedContext *)0x24bdad);
  Literal::Literal(&local_3c);
  local_34 = 1;
  local_38 = SatPreprocessor::Clause::size(local_20);
  for (; local_34 != local_38; local_34 = local_34 + 1) {
    pLVar7 = SatPreprocessor::Clause::operator[](local_20,local_34);
    local_3c.rep_ = pLVar7->rep_;
    bVar3 = Solver::isFalse(in_stack_ffffffffffffff58,in_stack_ffffffffffffff64);
    if (!bVar3) {
      pEVar9 = (EVP_PKEY_CTX *)(ulong)local_3c.rep_;
      bVar3 = Solver::isTrue(in_stack_ffffffffffffff58,in_stack_ffffffffffffff64);
      uVar11 = (uint32)((ulong)in_stack_ffffffffffffff50 >> 0x20);
      if (bVar3) goto LAB_0024c18d;
      in_stack_ffffffffffffff90 = *(SatElite **)(in_RDI + 0x58);
      VVar4 = Literal::var(&local_3c);
      pSVar1 = &in_stack_ffffffffffffff90->super_SatPreprocessor;
      iVar5 = Literal::sign(&local_3c,pEVar9,sig,(size_t *)((ulong)VVar4 * 0x20),in_R8,in_R9);
      OccurList::mark((OccurList *)(&pSVar1->_vptr_SatPreprocessor + (ulong)VVar4 * 4),
                      (bool)((byte)iVar5 & 1));
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                 CONCAT44(in_stack_ffffffffffffff64.rep_,in_stack_ffffffffffffff60),
                 (Literal *)in_stack_ffffffffffffff58);
    }
  }
  local_34 = 1;
  local_38 = SatPreprocessor::Clause::size(local_28);
  for (; uVar11 = (uint32)((ulong)in_stack_ffffffffffffff50 >> 0x20), local_34 != local_38;
      local_34 = local_34 + 1) {
    pLVar7 = SatPreprocessor::Clause::operator[](local_28,local_34);
    local_3c.rep_ = pLVar7->rep_;
    pEVar9 = (EVP_PKEY_CTX *)(ulong)local_3c.rep_;
    bVar3 = Solver::isFalse(in_stack_ffffffffffffff58,in_stack_ffffffffffffff64);
    if (!bVar3) {
      lVar10 = *(long *)(in_RDI + 0x58);
      VVar4 = Literal::var(&local_3c);
      in_stack_ffffffffffffff88 = (OccurList *)(lVar10 + (long)((ulong)VVar4 * 0x20));
      iVar5 = Literal::sign(&local_3c,pEVar9,sig_00,(size_t *)((ulong)VVar4 * 0x20),in_R8,in_R9);
      bVar3 = OccurList::marked(in_stack_ffffffffffffff88,(bool)((byte)iVar5 & 1));
      if (!bVar3) {
        pEVar9 = (EVP_PKEY_CTX *)(ulong)local_3c.rep_;
        bVar3 = Solver::isTrue(in_stack_ffffffffffffff58,in_stack_ffffffffffffff64);
        uVar11 = (uint32)((ulong)in_stack_ffffffffffffff50 >> 0x20);
        if (bVar3) goto LAB_0024c18d;
        in_stack_ffffffffffffff70 = *(SatPreprocessor **)(in_RDI + 0x58);
        VVar4 = Literal::var(&local_3c);
        ppp_Var2 = &in_stack_ffffffffffffff70->_vptr_SatPreprocessor;
        iVar5 = Literal::sign(&local_3c,pEVar9,sig_01,(size_t *)((ulong)VVar4 * 0x20),in_R8,in_R9);
        OccurList::mark((OccurList *)(ppp_Var2 + (ulong)VVar4 * 4),(bool)((byte)iVar5 & 1));
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                   CONCAT44(in_stack_ffffffffffffff64.rep_,in_stack_ffffffffffffff60),
                   (Literal *)in_stack_ffffffffffffff58);
      }
    }
  }
  bVar3 = subsumed((SatElite *)lhs,(LitVec *)rhs);
  if (bVar3) {
LAB_0024c18d:
    bVar3 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::empty
                      ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                       (in_RDI + 0xb8));
    if (!bVar3) {
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 0xb8),0);
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size
                ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 0xb8));
      unmarkAll((SatElite *)CONCAT44(in_stack_ffffffffffffff64.rep_,in_stack_ffffffffffffff60),
                (Literal *)in_stack_ffffffffffffff58,uVar11);
    }
    local_1 = true;
  }
  else {
    bVar3 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::empty
                      ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                       (in_RDI + 0xb8));
    if (bVar3) {
      this_00 = local_30;
      negLit(0x24c063);
      local_1 = Solver::force(this_00,(Literal)(uint32)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    }
    else {
      sVar6 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size
                        ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                         (in_RDI + 0xb8));
      if (sVar6 == 1) {
        lVar10 = *(long *)(in_RDI + 0x58);
        pLVar8 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                           ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                            (in_RDI + 0xb8),0);
        p.rep_ = (uint32)((ulong)in_stack_ffffffffffffff70 >> 0x20);
        VVar4 = Literal::var(pLVar8);
        OccurList::unmark((OccurList *)(lVar10 + (ulong)VVar4 * 0x20));
        pLVar8 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                           ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                            (in_RDI + 0xb8),0);
        uVar11 = pLVar8->rep_;
        bVar3 = Solver::force(in_stack_ffffffffffffff68,p);
        local_1 = false;
        if (bVar3) {
          bVar3 = Solver::propagate(in_stack_ffffffffffffff48);
          local_1 = false;
          if (bVar3) {
            local_1 = propagateFacts((SatElite *)CONCAT44(uVar11,in_stack_ffffffffffffffa8));
          }
        }
      }
      else {
        SatPreprocessor::setClause
                  (in_stack_ffffffffffffff70,(uint32)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                   (LitVec *)CONCAT44(in_stack_ffffffffffffff64.rep_,in_stack_ffffffffffffff60));
        attach(in_stack_ffffffffffffff90,(uint32)((ulong)in_stack_ffffffffffffff88 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff88 >> 0x18,0));
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool SatElite::addResolvent(uint32 id, const Clause& lhs, const Clause& rhs) {
	resolvent_.clear();
	Solver* s = ctx_->master();
	assert(lhs[0] == ~rhs[0]);
	uint32 i, end;
	Literal l;
	for (i = 1, end = lhs.size(); i != end; ++i) {
		l = lhs[i];
		if (!s->isFalse(l)) {
			if (s->isTrue(l)) goto unmark;
			occurs_[l.var()].mark(l.sign());
			resolvent_.push_back(l);
		}
	}
	for (i = 1, end = rhs.size(); i != end; ++i) {
		l = rhs[i];
		if (!s->isFalse(l) && !occurs_[l.var()].marked(l.sign())) {
			if (s->isTrue(l)) goto unmark;
			occurs_[l.var()].mark(l.sign());
			resolvent_.push_back(l);
		}
	}
	if (!subsumed(resolvent_))  {
		if (resolvent_.empty())   {
			return s->force(negLit(0));
		}
		if (resolvent_.size()==1) {
			occurs_[resolvent_[0].var()].unmark();
			return s->force(resolvent_[0]) && s->propagate() && propagateFacts();
		}
		setClause(id, resolvent_);
		attach(id, false);
		return true;
	}
unmark:
	if (!resolvent_.empty()) {
		unmarkAll(&resolvent_[0], resolvent_.size());
	}
	return true;
}